

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall
smf::Binasc::getWord(Binasc *this,string *word,string *input,string *terminators,int index)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  int local_40;
  int ecount;
  int escape;
  int i;
  int index_local;
  string *terminators_local;
  string *input_local;
  string *word_local;
  Binasc *this_local;
  
  std::__cxx11::string::resize((ulong)word);
  local_40 = 0;
  lVar2 = std::__cxx11::string::find((char)terminators,0x22);
  ecount = index;
  while( true ) {
    while( true ) {
      iVar1 = std::__cxx11::string::size();
      if (iVar1 <= ecount) {
        return ecount;
      }
      if ((lVar2 != -1) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar3 == '\"')) {
        local_40 = local_40 + 1;
        ecount = ecount + 1;
        if (1 < local_40) {
          return ecount;
        }
      }
      if ((((lVar2 == -1) || (iVar1 = std::__cxx11::string::size(), iVar1 + -1 <= ecount)) ||
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar3 != '\\')) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar3 != '\"')) break;
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)word);
      ecount = ecount + 2;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    lVar4 = std::__cxx11::string::find((char)terminators,(ulong)(uint)(int)*pcVar3);
    if (lVar4 != -1) break;
    std::__cxx11::string::operator[]((ulong)input);
    std::__cxx11::string::push_back((char)word);
    ecount = ecount + 1;
  }
  return ecount + 1;
}

Assistant:

int Binasc::getWord(std::string& word, const std::string& input,
		const std::string& terminators, int index) {
	word.resize(0);
	int i = index;
	int escape = 0;
	int ecount = 0;
	if (terminators.find('"') != std::string::npos) {
		escape = 1;
	}
	while (i < (int)input.size()) {
		if (escape && input[i] == '\"') {
			ecount++;
			i++;
			if (ecount >= 2) {
				break;
			}
		}
		if (escape && (i<(int)input.size()-1) && (input[i] == '\\')
				&& (input[i+1] == '"')) {
			word.push_back(input[i+1]);
			i += 2;
		} else if (terminators.find(input[i]) == std::string::npos) {
			word.push_back(input[i]);
			i++;
		} else {
			i++;
			return i;
		}
	}
	return i;
}